

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_type_info.hpp
# Opt level: O1

void __thiscall duckdb::LogicalTypeModifier::~LogicalTypeModifier(LogicalTypeModifier *this)

{
  pointer pcVar1;
  
  pcVar1 = (this->label)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->label).field_2) {
    operator_delete(pcVar1);
  }
  Value::~Value(&this->value);
  return;
}

Assistant:

explicit LogicalTypeModifier(Value value_p) : value(std::move(value_p)) {
	}